

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::argument_loader<kratos::Simulator*,kratos::Var*,std::optional<unsigned_long>,bool>
::load_impl_sequence<0ul,1ul,2ul,3ul>
          (argument_loader<kratos::Simulator*,kratos::Var*,std::optional<unsigned_long>,bool> *this,
          long call)

{
  handle src;
  bool bVar1;
  long lVar2;
  uint uVar3;
  type_caster<unsigned_long,_void> local_20;
  value_conv inner_caster;
  
  bVar1 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 0x30),(PyObject *)**(undefined8 **)(call + 8),
                     (bool)((byte)**(undefined4 **)(call + 0x20) & 1));
  if ((bVar1) &&
     (bVar1 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                        ((type_caster_generic *)(this + 0x18),
                         *(PyObject **)(*(long *)(call + 8) + 8),
                         SUB41((**(uint **)(call + 0x20) & 2) >> 1,0)), bVar1)) {
    lVar2 = *(long *)(call + 8);
    src.m_ptr = *(PyObject **)(lVar2 + 0x10);
    if (src.m_ptr != (PyObject *)0x0) {
      uVar3 = (uint)**(undefined8 **)(call + 0x20);
      if (src.m_ptr != (PyObject *)&_Py_NoneStruct) {
        bVar1 = type_caster<unsigned_long,_void>::load(&local_20,src,SUB41((uVar3 & 4) >> 2,0));
        if (!bVar1) {
          return false;
        }
        *(unsigned_long *)(this + 8) = local_20.value;
        this[0x10] = (argument_loader<kratos::Simulator*,kratos::Var*,std::optional<unsigned_long>,bool>
                      )0x1;
        lVar2 = *(long *)(call + 8);
        uVar3 = (uint)**(undefined8 **)(call + 0x20);
      }
      bVar1 = type_caster<bool,_void>::load
                        ((type_caster<bool,_void> *)this,*(PyObject **)(lVar2 + 0x18),
                         SUB41((uVar3 & 8) >> 3,0));
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }